

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O3

ParserResult * __thiscall
Catch::Clara::Detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3111:35)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3111:35)>
          *this,string *arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  int iVar3;
  TestRunOrder TVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  ulong *puVar7;
  size_t __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  ulong local_c0;
  ulong uStack_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3111:35)>
  *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined **local_60;
  undefined8 local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_88 = this;
  std::__cxx11::string::_M_assign((string *)&local_a8);
  sVar2 = local_a8._M_string_length;
  local_58 = 0;
  local_60 = &PTR__BasicResult_001b1540;
  local_48 = 0;
  local_40 = 0;
  local_c0 = 0x646572616c636564;
  uStack_b8 = uStack_b8 & 0xffffffffffffff00;
  local_50 = &local_40;
  if (8 < local_a8._M_string_length) goto LAB_00160ef9;
  if (local_a8._M_string_length == 0) {
LAB_00161005:
    TVar4 = Declared;
  }
  else {
    local_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_a8._M_dataplus._M_p;
    iVar3 = bcmp(local_a8._M_dataplus._M_p,&local_c0,local_a8._M_string_length);
    if (iVar3 == 0) goto LAB_00161005;
    local_c0 = 0x6c61636978656c;
    if (sVar2 == 8) {
LAB_00160ef9:
      std::operator+(&local_80,"Unrecognised ordering: \'",&local_a8);
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_replace_aux
                         ((ulong)&local_80,local_80._M_string_length,0,'\x01');
      puVar7 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar7) {
        local_c0 = *puVar7;
        uStack_b8 = puVar5[3];
        puVar6 = &local_c0;
      }
      else {
        local_c0 = *puVar7;
        puVar6 = (ulong *)*puVar5;
      }
      sVar2 = puVar5[1];
      *puVar5 = puVar7;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
      super_ResultBase.m_type = RuntimeError;
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b1540;
      paVar1 = &(__return_storage_ptr__->m_errorMessage).field_2;
      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
      if (puVar6 == &local_c0) {
        paVar1->_M_allocated_capacity = local_c0;
        *(ulong *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) = uStack_b8;
      }
      else {
        (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)puVar6;
        (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity = local_c0;
      }
      (__return_storage_ptr__->m_errorMessage)._M_string_length = sVar2;
      local_c0 = local_c0 & 0xffffffffffffff00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      local_60 = &PTR__BasicResult_001b1540;
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
      goto LAB_001610cf;
    }
    iVar3 = bcmp(local_b0,&local_c0,sVar2);
    if (iVar3 != 0) {
      local_c0 = CONCAT17(local_c0._7_1_,0x6d6f646e6172);
      if (sVar2 < 7) {
        iVar3 = bcmp(local_b0,&local_c0,sVar2);
        if (iVar3 == 0) {
          TVar4 = Randomized;
          goto LAB_00161007;
        }
      }
      goto LAB_00160ef9;
    }
    TVar4 = LexicographicallySorted;
  }
LAB_00161007:
  ((local_88->m_lambda).config)->runOrder = TVar4;
  *(undefined8 *)
   &(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
    m_type = 0;
  (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b1540;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
LAB_001610cf:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const& arg )
                    -> ParserResult override {
                    return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>(
                        m_lambda, arg );
                }